

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

void free(void *__ptr)

{
  hdbg_info *phVar1;
  memdesc **ppmVar2;
  memdesc *pmVar3;
  memdesc_node *pmVar4;
  _Bool _Var5;
  memstate mVar6;
  hdbg_info *phVar7;
  char *cp_1;
  char *msg;
  char *cp;
  memdesc *pmVar8;
  
  if (__ptr != (void *)0x0) {
    _Var5 = use_hdmp();
    if (_Var5) {
      pmVar8 = *(memdesc **)((long)__ptr + -0x10);
      mVar6 = get_state(pmVar8);
      if (mVar6 == mem_allocated) {
        if (pmVar8->data == (guard *)((long)__ptr + -0x10)) {
          getstacktrace(pmVar8->stack,(int)hdbg.maxframes);
          fill(pmVar8->data + 1,(int)pmVar8->len,0xdeaddead);
          set_state(pmVar8,mem_free);
          LOCK(&heap_lock);
          hdbg.stats.free_calls = hdbg.stats.free_calls + 1;
          hdbg.stats.alloc_total = hdbg.stats.alloc_total - pmVar8->len;
          phVar1 = (hdbg_info *)(pmVar8->node).tqe_next;
          ppmVar2 = (pmVar8->node).tqe_prev;
          phVar7 = phVar1;
          if (phVar1 == (hdbg_info *)0x0) {
            phVar7 = &hdbg;
          }
          ((memdesc_node *)&phVar7->heap)->tqe_prev = ppmVar2;
          *ppmVar2 = (memdesc *)phVar1;
          (pmVar8->node).tqe_next = hdbg.freelist.tqh_first;
          pmVar4 = &(hdbg.freelist.tqh_first)->node;
          if (hdbg.freelist.tqh_first == (memdesc *)0x0) {
            pmVar4 = (memdesc_node *)&hdbg.freelist;
          }
          pmVar4->tqe_prev = (memdesc **)pmVar8;
          hdbg.freelist.tqh_first = pmVar8;
          (pmVar8->node).tqe_prev = &hdbg.freelist.tqh_first;
          if (hdbg.freelistsize == hdbg.freelistmax) {
            pmVar8 = (hdbg.freelist.tqh_last[1]->node).tqe_next;
            pmVar3 = (pmVar8->node).tqe_next;
            ppmVar2 = (pmVar8->node).tqe_prev;
            pmVar4 = &pmVar3->node;
            if (pmVar3 == (memdesc *)0x0) {
              pmVar4 = (memdesc_node *)&hdbg.freelist;
            }
            pmVar4->tqe_prev = ppmVar2;
            *ppmVar2 = pmVar3;
          }
          else {
            hdbg.freelistsize = hdbg.freelistsize + 1;
            pmVar8 = (memdesc *)0x0;
          }
          UNLOCK(&heap_lock);
          if (pmVar8 == (memdesc *)0x0) {
            return;
          }
          __ptr = pmVar8->base;
          sanity_freenode(pmVar8);
          LOCK(&descriptors_lock);
          if ((pmVar8->len < hdbg.rememberbigger) || (hdbg.maxbig <= hdbg.numbig)) {
            (pmVar8->node).tqe_next = (memdesc *)0x0;
            (pmVar8->node).tqe_prev = hdbg.descriptors.tqh_last;
            *hdbg.descriptors.tqh_last = pmVar8;
            hdbg.descriptors.tqh_last = (memdesc **)pmVar8;
          }
          else {
            (pmVar8->node).tqe_next = (memdesc *)0x0;
            (pmVar8->node).tqe_prev = hdbg.freebig.tqh_last;
            *hdbg.freebig.tqh_last = pmVar8;
            hdbg.numbig = hdbg.numbig + 1;
            hdbg.freebig.tqh_last = (memdesc **)pmVar8;
          }
          UNLOCK(&descriptors_lock);
          if (__ptr <= malloc_headroom + 0xffff && malloc_headroom <= __ptr) {
            return;
          }
          goto LAB_00101832;
        }
        msg = "internal integrity error";
      }
      else {
        msg = "free() passed non-allocated memory";
      }
      die(msg);
    }
    if (malloc_headroom + 0xffff < __ptr || __ptr < malloc_headroom) {
LAB_00101832:
      (*real_free)(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void free(void *p) {
    if (p == 0)
        return;
    if (!use_hdmp()) {
        if (!headroom(p))
            real_free(p);
        return;
    }

    struct guard *guard = (struct guard *)p - 1;
    struct memdesc *desc = guard->desc;

    if (get_state(desc) != mem_allocated)
        die("free() passed non-allocated memory");
    if (desc->data != guard)
        die("internal integrity error");

    getstacktrace(desc->stack, hdbg.maxframes);
    fill(desc->data + 1, desc->len, 0xdeaddead);
    set_state(desc, mem_free);

    LOCK(&heap_lock);

    hdbg.stats.free_calls++;
    hdbg.stats.alloc_total -= desc->len;
    TAILQ_REMOVE(&hdbg.heap, desc, node);

    TAILQ_INSERT_HEAD(&hdbg.freelist, desc, node);
    // put this block on the freelist, and extract the oldest block if the list
    // is too big. We will actually free the oldest one now, so we have
    // maintained some hysteresis between the application calling free() and
    // actually freeing the memory.
    if (hdbg.freelistsize == hdbg.freelistmax) {
        desc = TAILQ_LAST(&hdbg.freelist, memdesc_list);
        TAILQ_REMOVE(&hdbg.freelist, desc, node);
    } else {
        hdbg.freelistsize++;
        desc = 0;
    }
    UNLOCK(&heap_lock);

    if (desc) {
        void *p = desc->base;
        free_desc(desc);
        if (!headroom(p))
            real_free(p);
    }
}